

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O0

void __thiscall
duckdb::WindowDistinctSortTree::Build
          (WindowDistinctSortTree *this,WindowDistinctAggregatorLocalState *ldastate)

{
  pointer ppVar1;
  bool bVar2;
  pointer ppVar3;
  vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
  *in_RDI;
  idx_t *in_stack_00000018;
  idx_t run_idx;
  idx_t level_idx;
  memory_order __b;
  WindowDistinctAggregatorLocalState *in_stack_000000d8;
  idx_t in_stack_000000e0;
  idx_t in_stack_000000e8;
  WindowDistinctSortTree *in_stack_000000f0;
  
  while( true ) {
    ::std::operator&(memory_order_seq_cst,__memory_order_mask);
    ppVar1 = in_RDI[3].
             super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (pointer)::std::
                      vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                      ::size(in_RDI);
    if (ppVar3 <= ppVar1) break;
    bVar2 = TryNextRun((WindowDistinctSortTree *)level_idx,(idx_t *)run_idx,in_stack_00000018);
    if (bVar2) {
      BuildRun(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    }
    else {
      ::std::this_thread::yield();
    }
  }
  return;
}

Assistant:

void WindowDistinctSortTree::Build(WindowDistinctAggregatorLocalState &ldastate) {
	//	Fan in parent levels until we are at the top
	//	Note that we don't build the top layer as that would just be all the data.
	while (build_level.load() < tree.size()) {
		idx_t level_idx;
		idx_t run_idx;
		if (TryNextRun(level_idx, run_idx)) {
			BuildRun(level_idx, run_idx, ldastate);
		} else {
			std::this_thread::yield();
		}
	}
}